

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Builder * __thiscall
capnp::DynamicList::Builder::operator[](Builder *__return_storage_ptr__,Builder *this,uint index)

{
  double value;
  Builder value_00;
  ListBuilder builder;
  ListBuilder builder_00;
  StructBuilder builder_01;
  Builder value_01;
  Builder value_02;
  Builder value_03;
  ListSchema schema;
  ListSchema schema_00;
  Type TVar1;
  bool bVar2;
  char value_04;
  uchar value_05;
  ElementSize elementSize;
  Which WVar3;
  short value_06;
  unsigned_short uVar4;
  int value_07;
  uint uVar5;
  long value_08;
  unsigned_long value_09;
  float value_10;
  DynamicEnum value_11;
  Builder value_12;
  PointerBuilder local_2c0;
  PointerBuilder local_2a8;
  Client local_290;
  Fault local_278;
  Fault f_1;
  DynamicEnum local_268;
  StructBuilder local_258;
  Schema local_230;
  Builder local_228;
  PointerBuilder local_1f8;
  ListBuilder local_1e0;
  Type local_1b8;
  Builder local_1a8;
  Schema local_170;
  StructSize local_164;
  PointerBuilder local_160;
  ListBuilder local_148;
  Type local_120;
  Builder local_110;
  undefined1 local_d8 [8];
  ListSchema elementType;
  PointerBuilder local_a0;
  Builder local_88;
  Fault local_60;
  Fault f;
  uint *local_50;
  undefined1 local_48 [8];
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition;
  uint index_local;
  Builder *this_local;
  
  _kjCondition._36_4_ = index;
  local_50 = (uint *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                (uint *)&_kjCondition.field_0x24);
  f.exception._4_4_ = size(this);
  kj::_::DebugExpression<unsigned_int&>::operator<
            ((DebugComparison<unsigned_int_&,_unsigned_int> *)local_48,
             (DebugExpression<unsigned_int&> *)&local_50,(uint *)((long)&f.exception + 4));
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (bVar2) {
    WVar3 = ListSchema::whichElementType(&this->schema);
    switch(WVar3) {
    case VOID:
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      capnp::_::ListBuilder::getDataElement<capnp::Void>(&this->builder,uVar5);
      DynamicValue::Builder::Builder(__return_storage_ptr__);
      break;
    case BOOL:
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      bVar2 = capnp::_::ListBuilder::getDataElement<bool>(&this->builder,uVar5);
      DynamicValue::Builder::Builder(__return_storage_ptr__,bVar2);
      break;
    case INT8:
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      value_04 = capnp::_::ListBuilder::getDataElement<signed_char>(&this->builder,uVar5);
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_04);
      break;
    case INT16:
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      value_06 = capnp::_::ListBuilder::getDataElement<short>(&this->builder,uVar5);
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_06);
      break;
    case INT32:
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      value_07 = capnp::_::ListBuilder::getDataElement<int>(&this->builder,uVar5);
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_07);
      break;
    case INT64:
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      value_08 = capnp::_::ListBuilder::getDataElement<long>(&this->builder,uVar5);
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_08);
      break;
    case UINT8:
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      value_05 = capnp::_::ListBuilder::getDataElement<unsigned_char>(&this->builder,uVar5);
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_05);
      break;
    case UINT16:
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      uVar4 = capnp::_::ListBuilder::getDataElement<unsigned_short>(&this->builder,uVar5);
      DynamicValue::Builder::Builder(__return_storage_ptr__,uVar4);
      break;
    case UINT32:
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      uVar5 = capnp::_::ListBuilder::getDataElement<unsigned_int>(&this->builder,uVar5);
      DynamicValue::Builder::Builder(__return_storage_ptr__,uVar5);
      break;
    case UINT64:
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      value_09 = capnp::_::ListBuilder::getDataElement<unsigned_long>(&this->builder,uVar5);
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_09);
      break;
    case FLOAT32:
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      value_10 = capnp::_::ListBuilder::getDataElement<float>(&this->builder,uVar5);
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_10);
      break;
    case FLOAT64:
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      value = capnp::_::ListBuilder::getDataElement<double>(&this->builder,uVar5);
      DynamicValue::Builder::Builder(__return_storage_ptr__,value);
      break;
    case TEXT:
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      capnp::_::ListBuilder::getPointerElement(&local_a0,&this->builder,uVar5);
      capnp::_::PointerBuilder::getBlob<capnp::Text>(&local_88,&local_a0,(void *)0x0,0);
      value_00.content.ptr = local_88.content.ptr;
      value_00._0_8_ = local_88._0_8_;
      value_00.content.size_ = local_88.content.size_;
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_00);
      break;
    case DATA:
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      capnp::_::ListBuilder::getPointerElement
                ((PointerBuilder *)&elementType.elementType.field_4,&this->builder,uVar5);
      value_12 = capnp::_::PointerBuilder::getBlob<capnp::Data>
                           ((PointerBuilder *)&elementType.elementType.field_4,(void *)0x0,0);
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_12);
      break;
    case LIST:
      _local_d8 = (Type)ListSchema::getListElementType(&this->schema);
      WVar3 = ListSchema::whichElementType((ListSchema *)local_d8);
      TVar1 = _local_d8;
      _local_d8 = TVar1;
      if (WVar3 == STRUCT) {
        local_120.baseType = local_d8._0_2_;
        local_120.listDepth = local_d8[2];
        local_120.isImplicitParam = (bool)local_d8[3];
        local_120.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_d8._4_2_;
        local_120._6_2_ = local_d8._6_2_;
        local_120.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)elementType.elementType._0_8_;
        uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
        capnp::_::ListBuilder::getPointerElement(&local_160,&this->builder,uVar5);
        local_170.raw = (RawBrandedSchema *)ListSchema::getStructElementType((ListSchema *)local_d8)
        ;
        local_164 = anon_unknown_70::structSizeFromSchema((StructSchema)local_170.raw);
        capnp::_::PointerBuilder::getStructList(&local_148,&local_160,local_164,(word *)0x0);
        schema_00.elementType.field_4.schema = local_120.field_4.schema;
        schema_00.elementType.baseType = local_120.baseType;
        schema_00.elementType.listDepth = local_120.listDepth;
        schema_00.elementType.isImplicitParam = local_120.isImplicitParam;
        schema_00.elementType.field_3 = local_120.field_3;
        schema_00.elementType._6_2_ = local_120._6_2_;
        builder.capTable = local_148.capTable;
        builder.segment = local_148.segment;
        builder.ptr = local_148.ptr;
        builder.elementCount = local_148.elementCount;
        builder.step = local_148.step;
        builder.structDataSize = local_148.structDataSize;
        builder.structPointerCount = local_148.structPointerCount;
        builder.elementSize = local_148.elementSize;
        builder._39_1_ = local_148._39_1_;
        Builder(&local_110,schema_00,builder);
        value_02.schema.elementType.field_4.schema = local_110.schema.elementType.field_4.schema;
        value_02.schema.elementType.baseType = local_110.schema.elementType.baseType;
        value_02.schema.elementType.listDepth = local_110.schema.elementType.listDepth;
        value_02.schema.elementType.isImplicitParam = local_110.schema.elementType.isImplicitParam;
        value_02.schema.elementType.field_3 = local_110.schema.elementType.field_3;
        value_02.schema.elementType._6_2_ = local_110.schema.elementType._6_2_;
        value_02.builder.segment = local_110.builder.segment;
        value_02.builder.capTable = local_110.builder.capTable;
        value_02.builder.ptr = local_110.builder.ptr;
        value_02.builder.elementCount = local_110.builder.elementCount;
        value_02.builder.step = local_110.builder.step;
        value_02.builder.structDataSize = local_110.builder.structDataSize;
        value_02.builder.structPointerCount = local_110.builder.structPointerCount;
        value_02.builder.elementSize = local_110.builder.elementSize;
        value_02.builder._39_1_ = local_110.builder._39_1_;
        DynamicValue::Builder::Builder(__return_storage_ptr__,value_02);
      }
      else {
        local_1b8.baseType = local_d8._0_2_;
        local_1b8.listDepth = local_d8[2];
        local_1b8.isImplicitParam = (bool)local_d8[3];
        local_1b8.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_d8._4_2_;
        local_1b8._6_2_ = local_d8._6_2_;
        local_1b8.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)elementType.elementType._0_8_;
        uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
        capnp::_::ListBuilder::getPointerElement(&local_1f8,&this->builder,uVar5);
        WVar3 = ListSchema::whichElementType((ListSchema *)local_d8);
        elementSize = anon_unknown_70::elementSizeFor(WVar3);
        capnp::_::PointerBuilder::getList(&local_1e0,&local_1f8,elementSize,(word *)0x0);
        schema.elementType.field_4.schema = local_1b8.field_4.schema;
        schema.elementType.baseType = local_1b8.baseType;
        schema.elementType.listDepth = local_1b8.listDepth;
        schema.elementType.isImplicitParam = local_1b8.isImplicitParam;
        schema.elementType.field_3 = local_1b8.field_3;
        schema.elementType._6_2_ = local_1b8._6_2_;
        builder_00.capTable = local_1e0.capTable;
        builder_00.segment = local_1e0.segment;
        builder_00.ptr = local_1e0.ptr;
        builder_00.elementCount = local_1e0.elementCount;
        builder_00.step = local_1e0.step;
        builder_00.structDataSize = local_1e0.structDataSize;
        builder_00.structPointerCount = local_1e0.structPointerCount;
        builder_00.elementSize = local_1e0.elementSize;
        builder_00._39_1_ = local_1e0._39_1_;
        Builder(&local_1a8,schema,builder_00);
        value_03.schema.elementType.field_4.schema = local_1a8.schema.elementType.field_4.schema;
        value_03.schema.elementType.baseType = local_1a8.schema.elementType.baseType;
        value_03.schema.elementType.listDepth = local_1a8.schema.elementType.listDepth;
        value_03.schema.elementType.isImplicitParam = local_1a8.schema.elementType.isImplicitParam;
        value_03.schema.elementType.field_3 = local_1a8.schema.elementType.field_3;
        value_03.schema.elementType._6_2_ = local_1a8.schema.elementType._6_2_;
        value_03.builder.segment = local_1a8.builder.segment;
        value_03.builder.capTable = local_1a8.builder.capTable;
        value_03.builder.ptr = local_1a8.builder.ptr;
        value_03.builder.elementCount = local_1a8.builder.elementCount;
        value_03.builder.step = local_1a8.builder.step;
        value_03.builder.structDataSize = local_1a8.builder.structDataSize;
        value_03.builder.structPointerCount = local_1a8.builder.structPointerCount;
        value_03.builder.elementSize = local_1a8.builder.elementSize;
        value_03.builder._39_1_ = local_1a8.builder._39_1_;
        DynamicValue::Builder::Builder(__return_storage_ptr__,value_03);
      }
      break;
    case ENUM:
      f_1.exception = (Exception *)ListSchema::getEnumElementType(&this->schema);
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      uVar4 = capnp::_::ListBuilder::getDataElement<unsigned_short>(&this->builder,uVar5);
      DynamicEnum::DynamicEnum(&local_268,(EnumSchema)f_1.exception,uVar4);
      value_11._10_6_ = 0;
      value_11.schema.super_Schema.raw = local_268.schema.super_Schema.raw;
      value_11.value = local_268.value;
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_11);
      break;
    case STRUCT:
      local_230.raw = (RawBrandedSchema *)ListSchema::getStructElementType(&this->schema);
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      capnp::_::ListBuilder::getStructElement(&local_258,&this->builder,uVar5);
      builder_01.capTable = local_258.capTable;
      builder_01.segment = local_258.segment;
      builder_01.data = local_258.data;
      builder_01.pointers = local_258.pointers;
      builder_01.dataSize = local_258.dataSize;
      builder_01.pointerCount = local_258.pointerCount;
      builder_01._38_2_ = local_258._38_2_;
      DynamicStruct::Builder::Builder(&local_228,(StructSchema)local_230.raw,builder_01);
      value_01.builder.segment = local_228.builder.segment;
      value_01.schema.super_Schema.raw = local_228.schema.super_Schema.raw;
      value_01.builder.capTable = local_228.builder.capTable;
      value_01.builder.data = local_228.builder.data;
      value_01.builder.pointers = local_228.builder.pointers;
      value_01.builder.dataSize = local_228.builder.dataSize;
      value_01.builder.pointerCount = local_228.builder.pointerCount;
      value_01.builder._38_2_ = local_228.builder._38_2_;
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_01);
      break;
    case INTERFACE:
      local_2a8.pointer = (WirePointer *)ListSchema::getInterfaceElementType(&this->schema);
      uVar5 = bounded<unsigned_int>(_kjCondition._36_4_);
      capnp::_::ListBuilder::getPointerElement(&local_2c0,&this->builder,uVar5);
      capnp::_::PointerBuilder::getCapability(&local_2a8);
      DynamicCapability::Client::Client
                (&local_290,(InterfaceSchema)local_2a8.pointer,
                 (Own<capnp::ClientHook,_std::nullptr_t> *)&local_2a8);
      DynamicValue::Builder::Builder(__return_storage_ptr__,&local_290);
      DynamicCapability::Client::~Client(&local_290);
      kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
                ((Own<capnp::ClientHook,_std::nullptr_t> *)&local_2a8);
      break;
    case ANY_POINTER:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                (&local_278,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x47d,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
                 (char (*) [32])"List(AnyPointer) not supported.");
      kj::_::Debug::Fault::fatal(&local_278);
    default:
      DynamicValue::Builder::Builder(__return_storage_ptr__,(void *)0x0);
    }
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[26]>
            (&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
             ,0x44a,FAILED,"index < size()","_kjCondition,\"List index out-of-bounds.\"",
             (DebugComparison<unsigned_int_&,_unsigned_int> *)local_48,
             (char (*) [26])"List index out-of-bounds.");
  kj::_::Debug::Fault::fatal(&local_60);
}

Assistant:

DynamicValue::Builder DynamicList::Builder::operator[](uint index) {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      return builder.getDataElement<typeName>(bounded(index) * ELEMENTS);

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Text>(nullptr, ZERO * BYTES);
    case schema::Type::DATA:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Data>(nullptr, ZERO * BYTES);

    case schema::Type::LIST: {
      ListSchema elementType = schema.getListElementType();
      if (elementType.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getStructList(structSizeFromSchema(elementType.getStructElementType()),
                                  nullptr));
      } else {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getList(elementSizeFor(elementType.whichElementType()), nullptr));
      }
    }

    case schema::Type::STRUCT:
      return DynamicStruct::Builder(schema.getStructElementType(),
                                    builder.getStructElement(bounded(index) * ELEMENTS));

    case schema::Type::ENUM:
      return DynamicEnum(schema.getEnumElementType(),
                         builder.getDataElement<uint16_t>(bounded(index) * ELEMENTS));

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");
      return nullptr;

    case schema::Type::INTERFACE:
      return DynamicCapability::Client(schema.getInterfaceElementType(),
                                       builder.getPointerElement(bounded(index) * ELEMENTS)
                                              .getCapability());
  }

  return nullptr;
}